

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall Divide<4,_0,_4>::propagate(Divide<4,_0,_4> *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  IntVar *pIVar11;
  IntVar *pIVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  pIVar12 = (this->x).var;
  pIVar11 = (this->y).var;
  lVar6 = (long)(pIVar12->min).v;
  lVar9 = (long)(this->x).b;
  iVar3 = (pIVar12->max).v;
  lVar15 = (long)(pIVar11->min).v;
  lVar16 = (long)(pIVar11->max).v;
  pIVar11 = (this->z).var;
  uVar2 = (this->z).b;
  lVar10 = (long)(int)uVar2;
  lVar14 = (pIVar11->min).v + lVar10;
  lVar13 = (pIVar11->max).v + lVar10;
  lVar4 = (lVar16 + lVar6 + lVar9 + -1) / lVar16;
  lVar5 = lVar13;
  if (lVar14 < lVar4) {
    if (so.lazy) {
      iVar1 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[8])(pIVar12);
      uVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar7 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
      uVar2 = (this->z).b;
      pIVar11 = (this->z).var;
    }
    else {
      uVar7 = 0;
    }
    iVar1 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar11,lVar4 + (int)~uVar2 + 1,uVar7,1);
    if ((char)iVar1 == '\0') {
      return false;
    }
    pIVar11 = (this->z).var;
    lVar10 = (long)(this->z).b;
    lVar5 = (pIVar11->max).v + lVar10;
  }
  lVar8 = iVar3 + lVar9;
  lVar4 = (lVar15 + -1 + lVar8) / lVar15;
  if (lVar4 < lVar5) {
    if (so.lazy == true) {
      iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar7 = (ulong)uVar2 << 0x20 | (long)iVar3 << 2 | 3;
      lVar10 = (long)(this->z).b;
      pIVar11 = (this->z).var;
    }
    else {
      uVar7 = 0;
    }
    iVar3 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar11,lVar4 - lVar10,uVar7,1);
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  lVar15 = lVar15 * (lVar14 + -1);
  pIVar12 = (this->x).var;
  uVar2 = (this->x).b;
  lVar5 = (long)(int)uVar2;
  if ((pIVar12->min).v + lVar5 <= lVar15) {
    if (so.lazy == true) {
      iVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar2 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar7 = (ulong)uVar2 << 0x20 | (long)iVar3 << 2 | 3;
      uVar2 = (this->x).b;
      pIVar12 = (this->x).var;
    }
    else {
      uVar7 = 0;
    }
    iVar3 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar12,(int)~uVar2 + lVar15 + 2,uVar7,1);
    if ((char)iVar3 == '\0') {
      return false;
    }
    pIVar12 = (this->x).var;
    lVar5 = (long)(this->x).b;
  }
  if (lVar16 * lVar13 < (pIVar12->max).v + lVar5) {
    if (so.lazy == true) {
      iVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar2 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar7 = (ulong)uVar2 << 0x20 | (long)iVar3 << 2 | 3;
      lVar5 = (long)(this->x).b;
      pIVar12 = (this->x).var;
    }
    else {
      uVar7 = 0;
    }
    iVar3 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar12,lVar16 * lVar13 - lVar5,uVar7,1);
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  if (0 < lVar13) {
    lVar13 = (lVar6 + lVar9 + -1 + lVar13) / lVar13;
    pIVar12 = (this->y).var;
    if ((pIVar12->min).v < lVar13) {
      if (so.lazy == true) {
        iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar2 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar7 = (ulong)uVar2 << 0x20 | (long)iVar3 << 2 | 3;
        pIVar12 = (this->y).var;
      }
      else {
        uVar7 = 0;
      }
      iVar3 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xe])(pIVar12,lVar13,uVar7,1);
      if ((char)iVar3 == '\0') {
        return false;
      }
    }
  }
  if (lVar14 < 2) {
    return true;
  }
  lVar5 = (lVar8 + lVar14 + -2) / (lVar14 + -1);
  pIVar12 = (this->y).var;
  if (lVar5 <= (pIVar12->max).v) {
    if (so.lazy == true) {
      iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar2 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar7 = (ulong)uVar2 << 0x20 | (long)iVar3 << 2 | 3;
      pIVar12 = (this->y).var;
    }
    else {
      uVar7 = 0;
    }
    iVar3 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])(pIVar12,lVar5 + -1,uVar7,1)
    ;
    if ((char)iVar3 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}